

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

int64_t docio_read_doc_key_meta
                  (docio_handle *handle,uint64_t offset,docio_object *doc,bool read_on_cache_miss)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  docio_length length;
  void *pvVar7;
  byte in_CL;
  ushort *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  docio_length dVar22;
  uint8_t free_meta;
  err_log_callback *log_callback;
  docio_length zero_length;
  docio_length _length;
  timestamp_t _timestamp;
  fdb_seqnum_t _seqnum;
  int meta_alloc;
  int key_alloc;
  int64_t _offset;
  uint8_t checksum;
  undefined5 in_stack_fffffffffffffed8;
  uint8_t in_stack_fffffffffffffedd;
  uint8_t uVar23;
  uint8_t in_stack_fffffffffffffede;
  uint8_t uVar24;
  uint8_t in_stack_fffffffffffffedf;
  uint8_t uVar25;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar28;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff40 [16];
  unkbyte9 Var29;
  err_log_callback *log_callback_00;
  docio_length *in_stack_ffffffffffffff50;
  void *buf_out;
  uint64_t in_stack_ffffffffffffff58;
  uint32_t len;
  docio_handle *handle_00;
  undefined4 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6c;
  char in_stack_ffffffffffffff6d;
  char in_stack_ffffffffffffff6e;
  char in_stack_ffffffffffffff6f;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  uint8_t uStack_88;
  byte bStack_87;
  char cStack_86;
  char cStack_85;
  docio_length local_84;
  uint local_74;
  ulong local_70;
  undefined4 local_68;
  undefined4 local_64;
  fdb_status local_60;
  byte local_52;
  byte local_51;
  ushort *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  fdb_status local_38;
  
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  uVar26 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  Var29 = in_stack_ffffffffffffff40._7_9_;
  local_51 = in_CL & 1;
  local_64 = 0;
  local_68 = 0;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  docio_length::docio_length(&local_84);
  docio_length::docio_length((docio_length *)&stack0xffffffffffffff6c);
  handle_00 = (docio_handle *)local_40[6];
  _local_60 = (fdb_status)
              _docio_read_length(handle_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (err_log_callback *)((unkuint9)Var29 >> 8),SUB91(Var29,0));
  if ((long)_local_60 < 0) {
    if ((local_51 & 1) != 0) {
      fdb_log_impl((err_log_callback *)handle_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_read_doc_key_meta",0x465,0x19e855,(int)local_48,*(undefined8 *)*local_40)
      ;
    }
    _local_38 = _local_60;
  }
  else {
    memset(&stack0xffffffffffffff6c,0,0x10);
    cVar8 = -((char)local_84.metalen == in_stack_ffffffffffffff6e);
    cVar9 = -(local_84.metalen._1_1_ == in_stack_ffffffffffffff6f);
    cVar10 = -((char)local_84.bodylen == cStack_90);
    cVar11 = -(local_84.bodylen._1_1_ == cStack_8f);
    cVar12 = -(local_84.bodylen._2_1_ == cStack_8e);
    cVar13 = -(local_84.bodylen._3_1_ == cStack_8d);
    cVar14 = -((char)local_84.bodylen_ondisk == cStack_8c);
    cVar15 = -(local_84.bodylen_ondisk._1_1_ == cStack_8b);
    cVar16 = -(local_84.bodylen_ondisk._2_1_ == cStack_8a);
    cVar17 = -(local_84.bodylen_ondisk._3_1_ == cStack_89);
    cVar18 = -(local_84.flag == uStack_88);
    cVar19 = -(local_84.checksum == bStack_87);
    cVar20 = -((char)local_84.reserved == cStack_86);
    bVar21 = -(local_84.reserved._1_1_ == cStack_85);
    auVar1[1] = -(local_84.keylen._1_1_ == in_stack_ffffffffffffff6d);
    auVar1[0] = -((char)local_84.keylen == in_stack_ffffffffffffff6c);
    auVar1[2] = cVar8;
    auVar1[3] = cVar9;
    auVar1[4] = cVar10;
    auVar1[5] = cVar11;
    auVar1[6] = cVar12;
    auVar1[7] = cVar13;
    auVar1[8] = cVar14;
    auVar1[9] = cVar15;
    auVar1[10] = cVar16;
    auVar1[0xb] = cVar17;
    auVar1[0xc] = cVar18;
    auVar1[0xd] = cVar19;
    auVar1[0xe] = cVar20;
    auVar1[0xf] = bVar21;
    auVar2[1] = -(local_84.keylen._1_1_ == in_stack_ffffffffffffff6d);
    auVar2[0] = -((char)local_84.keylen == in_stack_ffffffffffffff6c);
    auVar2[2] = cVar8;
    auVar2[3] = cVar9;
    auVar2[4] = cVar10;
    auVar2[5] = cVar11;
    auVar2[6] = cVar12;
    auVar2[7] = cVar13;
    auVar2[8] = cVar14;
    auVar2[9] = cVar15;
    auVar2[10] = cVar16;
    auVar2[0xb] = cVar17;
    auVar2[0xc] = cVar18;
    auVar2[0xd] = cVar19;
    auVar2[0xe] = cVar20;
    auVar2[0xf] = bVar21;
    auVar6[1] = cVar9;
    auVar6[0] = cVar8;
    auVar6[2] = cVar10;
    auVar6[3] = cVar11;
    auVar6[4] = cVar12;
    auVar6[5] = cVar13;
    auVar6[6] = cVar14;
    auVar6[7] = cVar15;
    auVar6[8] = cVar16;
    auVar6[9] = cVar17;
    auVar6[10] = cVar18;
    auVar6[0xb] = cVar19;
    auVar6[0xc] = cVar20;
    auVar6[0xd] = bVar21;
    auVar5[1] = cVar10;
    auVar5[0] = cVar9;
    auVar5[2] = cVar11;
    auVar5[3] = cVar12;
    auVar5[4] = cVar13;
    auVar5[5] = cVar14;
    auVar5[6] = cVar15;
    auVar5[7] = cVar16;
    auVar5[8] = cVar17;
    auVar5[9] = cVar18;
    auVar5[10] = cVar19;
    auVar5[0xb] = cVar20;
    auVar5[0xc] = bVar21;
    auVar4[1] = cVar11;
    auVar4[0] = cVar10;
    auVar4[2] = cVar12;
    auVar4[3] = cVar13;
    auVar4[4] = cVar14;
    auVar4[5] = cVar15;
    auVar4[6] = cVar16;
    auVar4[7] = cVar17;
    auVar4[8] = cVar18;
    auVar4[9] = cVar19;
    auVar4[10] = cVar20;
    auVar4[0xb] = bVar21;
    auVar3[1] = cVar12;
    auVar3[0] = cVar11;
    auVar3[2] = cVar13;
    auVar3[3] = cVar14;
    auVar3[4] = cVar15;
    auVar3[5] = cVar16;
    auVar3[6] = cVar17;
    auVar3[7] = cVar18;
    auVar3[8] = cVar19;
    auVar3[9] = cVar20;
    auVar3[10] = bVar21;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar21,CONCAT18(cVar20,CONCAT17(cVar19,CONCAT16(cVar18,
                                                  CONCAT15(cVar17,CONCAT14(cVar16,CONCAT13(cVar15,
                                                  CONCAT12(cVar14,CONCAT11(cVar13,cVar12))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar21,CONCAT17(cVar20,CONCAT16(cVar19,CONCAT15(cVar18,
                                                  CONCAT14(cVar17,CONCAT13(cVar16,CONCAT12(cVar15,
                                                  CONCAT11(cVar14,cVar13)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar21 >> 7) << 0xf) == 0xffff) {
      *(ulong *)local_50 =
           CONCAT17(cStack_8d,
                    CONCAT16(cStack_8e,
                             CONCAT15(cStack_8f,
                                      CONCAT14(cStack_90,
                                               CONCAT13(in_stack_ffffffffffffff6f,
                                                        CONCAT12(in_stack_ffffffffffffff6e,
                                                                 CONCAT11(in_stack_ffffffffffffff6d,
                                                                          in_stack_ffffffffffffff6c)
                                                                ))))));
      *(ulong *)(local_50 + 4) =
           CONCAT17(cStack_85,
                    CONCAT16(cStack_86,
                             CONCAT15(bStack_87,
                                      CONCAT14(uStack_88,
                                               CONCAT13(cStack_89,
                                                        CONCAT12(cStack_8a,
                                                                 CONCAT11(cStack_8b,cStack_8c)))))))
      ;
      _local_38 = FDB_RESULT_SUCCESS;
    }
    else {
      buf_out = (void *)CONCAT17(local_84.bodylen._3_1_,
                                 CONCAT16(local_84.bodylen._2_1_,
                                          CONCAT15(local_84.bodylen._1_1_,
                                                   CONCAT14((char)local_84.bodylen,
                                                            CONCAT13(local_84.metalen._1_1_,
                                                                     CONCAT12((char)local_84.metalen
                                                                              ,CONCAT11(local_84.
                                                  keylen._1_1_,(char)local_84.keylen)))))));
      len = CONCAT13(local_84.reserved._1_1_,
                     CONCAT12((char)local_84.reserved,CONCAT11(local_84.checksum,local_84.flag)));
      dVar22.bodylen._1_1_ = in_stack_fffffffffffffedd;
      dVar22._0_5_ = in_stack_fffffffffffffed8;
      dVar22.bodylen._2_1_ = in_stack_fffffffffffffede;
      dVar22.bodylen._3_1_ = in_stack_fffffffffffffedf;
      dVar22.bodylen_ondisk = in_stack_fffffffffffffee0;
      dVar22.flag = (char)in_stack_fffffffffffffee4;
      dVar22.checksum = (char)((uint)in_stack_fffffffffffffee4 >> 8);
      dVar22.reserved = (short)((uint)in_stack_fffffffffffffee4 >> 0x10);
      local_52 = _docio_length_checksum(dVar22,(docio_handle *)0x13fa0c);
      if (local_52 == local_84.checksum) {
        length.bodylen_ondisk = (int)in_stack_fffffffffffffed8;
        length.flag = (char)((uint5)in_stack_fffffffffffffed8 >> 0x20);
        length.keylen = 0xfb0b;
        length.metalen = 0x13;
        length.bodylen = 0;
        length.checksum = in_stack_fffffffffffffedd;
        length.reserved._0_1_ = in_stack_fffffffffffffede;
        length.reserved._1_1_ = in_stack_fffffffffffffedf;
        dVar22 = _docio_length_decode(length);
        *(long *)local_50 = dVar22._0_8_;
        log_callback_00 = dVar22._8_8_;
        *(err_log_callback **)(local_50 + 4) = log_callback_00;
        if ((*local_50 == 0) || (0xfff0 < *local_50)) {
          fdb_log_impl((err_log_callback *)handle_00,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_key_meta",0x482,0x19eab6,(uint)*local_50,
                       *(undefined8 *)*local_40);
          _local_38 = 0xfffffffffffffff0;
        }
        else {
          if (*(long *)(local_50 + 0xc) == 0) {
            pvVar7 = malloc((ulong)*local_50);
            *(void **)(local_50 + 0xc) = pvVar7;
            local_64 = 1;
          }
          if ((*(long *)(local_50 + 0x14) == 0) && (local_50[1] != 0)) {
            pvVar7 = malloc((ulong)local_50[1]);
            *(void **)(local_50 + 0x14) = pvVar7;
            local_68 = 1;
          }
          _local_60 = (fdb_status)
                      _docio_read_doc_component
                                ((docio_handle *)
                                 CONCAT17(in_stack_ffffffffffffff6f,
                                          CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT15(in_stack_ffffffffffffff6d,
                                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                                     in_stack_ffffffffffffff68)))),
                                 (uint64_t)handle_00,len,buf_out,log_callback_00);
          if ((long)_local_60 < 0) {
            uVar23 = '\0';
            uVar24 = '\0';
            uVar25 = '\0';
            uVar26 = (undefined4)local_48;
            uVar28 = (undefined4)((ulong)local_48 >> 0x20);
            fdb_log_impl((err_log_callback *)handle_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff)
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_read_doc_key_meta",0x495,0x19e9bb,uVar26,
                         CONCAT44(uVar27,(uint)*local_50),*(undefined8 *)*local_40);
            free_docio_object((docio_object *)CONCAT44(uVar28,uVar26),uVar25,uVar24,uVar23);
            _local_38 = _local_60;
          }
          else {
            _local_60 = (fdb_status)
                        _docio_read_doc_component
                                  ((docio_handle *)
                                   CONCAT17(in_stack_ffffffffffffff6f,
                                            CONCAT16(in_stack_ffffffffffffff6e,
                                                     CONCAT15(in_stack_ffffffffffffff6d,
                                                              CONCAT14(in_stack_ffffffffffffff6c,
                                                                       in_stack_ffffffffffffff68))))
                                   ,(uint64_t)handle_00,len,buf_out,log_callback_00);
            if ((long)_local_60 < 0) {
              uVar23 = '\0';
              uVar24 = '\0';
              uVar25 = '\0';
              uVar27 = (undefined4)local_48;
              uVar26 = (undefined4)((ulong)local_48 >> 0x20);
              fdb_log_impl((err_log_callback *)handle_00,2,
                           (fdb_status)((ulong)_local_60 & 0xffffffff),
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,"docio_read_doc_key_meta",0x4a2,0x19eb0b,uVar27,4,
                           *(undefined8 *)*local_40);
              free_docio_object((docio_object *)CONCAT44(uVar26,uVar27),uVar25,uVar24,uVar23);
              _local_38 = _local_60;
            }
            else {
              *(uint *)(local_50 + 8) =
                   local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
              _local_60 = (fdb_status)
                          _docio_read_doc_component
                                    ((docio_handle *)
                                     CONCAT17(in_stack_ffffffffffffff6f,
                                              CONCAT16(in_stack_ffffffffffffff6e,
                                                       CONCAT15(in_stack_ffffffffffffff6d,
                                                                CONCAT14(in_stack_ffffffffffffff6c,
                                                                         in_stack_ffffffffffffff68))
                                                      )),(uint64_t)handle_00,len,buf_out,
                                     log_callback_00);
              if ((long)_local_60 < 0) {
                uVar23 = '\0';
                uVar24 = '\0';
                uVar25 = '\0';
                uVar27 = (undefined4)local_48;
                uVar26 = (undefined4)((ulong)local_48 >> 0x20);
                fdb_log_impl((err_log_callback *)handle_00,2,
                             (fdb_status)((ulong)_local_60 & 0xffffffff),
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                             ,"docio_read_doc_key_meta",0x4af,0x19eb5d,uVar27,8,
                             *(undefined8 *)*local_40);
                free_docio_object((docio_object *)CONCAT44(uVar26,uVar27),uVar25,uVar24,uVar23);
                _local_38 = _local_60;
              }
              else {
                *(ulong *)(local_50 + 0x10) =
                     local_70 >> 0x38 | (local_70 & 0xff000000000000) >> 0x28 |
                     (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
                     (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
                     (local_70 & 0xff00) << 0x28 | local_70 << 0x38;
                _local_60 = (fdb_status)
                            _docio_read_doc_component
                                      ((docio_handle *)
                                       CONCAT17(in_stack_ffffffffffffff6f,
                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                                  CONCAT14(in_stack_ffffffffffffff6c
                                                                           ,
                                                  in_stack_ffffffffffffff68)))),(uint64_t)handle_00,
                                       len,buf_out,log_callback_00);
                if ((long)_local_60 < 0) {
                  uVar23 = '\0';
                  uVar24 = '\0';
                  uVar25 = '\0';
                  uVar26 = (undefined4)local_48;
                  uVar28 = (undefined4)((ulong)local_48 >> 0x20);
                  fdb_log_impl((err_log_callback *)handle_00,2,
                               (fdb_status)((ulong)_local_60 & 0xffffffff),
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                               ,"docio_read_doc_key_meta",0x4bb,0x19ebb5,uVar26,
                               CONCAT44(uVar27,(uint)local_50[1]),*(undefined8 *)*local_40);
                  free_docio_object((docio_object *)CONCAT44(uVar28,uVar26),uVar25,uVar24,uVar23);
                  _local_38 = _local_60;
                }
                else {
                  free_docio_object((docio_object *)
                                    CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                    in_stack_fffffffffffffedf,in_stack_fffffffffffffede,
                                    in_stack_fffffffffffffedd);
                  _local_38 = _local_60;
                }
              }
            }
          }
        }
      }
      else {
        fdb_log_impl((err_log_callback *)handle_00,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_key_meta",0x47a,0x19ea1f,(int)*(undefined8 *)*local_40,
                     CONCAT44(uVar27,(uint)local_52),CONCAT44(uVar26,(uint)local_84.checksum),
                     (uint)CONCAT11(local_84.keylen._1_1_,(char)local_84.keylen),
                     (uint)CONCAT11(local_84.metalen._1_1_,(char)local_84.metalen),
                     CONCAT13(local_84.bodylen._3_1_,
                              CONCAT12(local_84.bodylen._2_1_,
                                       CONCAT11(local_84.bodylen._1_1_,(char)local_84.bodylen))),
                     CONCAT13(local_84.bodylen_ondisk._3_1_,
                              CONCAT12(local_84.bodylen_ondisk._2_1_,
                                       CONCAT11(local_84.bodylen_ondisk._1_1_,
                                                (char)local_84.bodylen_ondisk))),local_48);
        _local_38 = 0xfffffffffffffff1;
      }
    }
  }
  return (int64_t)_local_38;
}

Assistant:

int64_t docio_read_doc_key_meta(struct docio_handle *handle, uint64_t offset,
                                struct docio_object *doc,
                                bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length meta checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s'", doc->length.keylen, handle->file->filename);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset, doc->length.keylen,
                                        doc->key, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy sequence number (optional)
    _offset = _docio_read_doc_component(handle, _offset, sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    free_docio_object(doc, 0, free_meta, 0);

    return _offset;
}